

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O0

void VP8IteratorSetRow(VP8EncIterator *it,int y)

{
  long lVar1;
  uint in_ESI;
  undefined4 *in_RDI;
  VP8Encoder *enc;
  
  lVar1 = *(long *)(in_RDI + 10);
  *in_RDI = 0;
  in_RDI[1] = in_ESI;
  *(long *)(in_RDI + 0xe) = lVar1 + 0x70 + (long)(int)(in_ESI & *(int *)(lVar1 + 0x3c) - 1U) * 0x30;
  *(long *)(in_RDI + 0x10) =
       *(long *)(lVar1 + 0x5c68) + (long)(int)(in_ESI * 4 * *(int *)(lVar1 + 0x38));
  *(undefined8 *)(in_RDI + 0x12) = *(undefined8 *)(lVar1 + 0x5c70);
  *(long *)(in_RDI + 0xc) =
       *(long *)(lVar1 + 0x5c60) + (long)(int)(in_ESI * *(int *)(lVar1 + 0x30)) * 4;
  *(undefined8 *)(in_RDI + 0x60) = *(undefined8 *)(lVar1 + 0x5c78);
  *(undefined8 *)(in_RDI + 0x62) = *(undefined8 *)(lVar1 + 0x5c80);
  InitLeft((VP8EncIterator *)0x17a138);
  return;
}

Assistant:

void VP8IteratorSetRow(VP8EncIterator* const it, int y) {
  VP8Encoder* const enc = it->enc;
  it->x = 0;
  it->y = y;
  it->bw = &enc->parts[y & (enc->num_parts - 1)];
  it->preds = enc->preds + y * 4 * enc->preds_w;
  it->nz = enc->nz;
  it->mb = enc->mb_info + y * enc->mb_w;
  it->y_top = enc->y_top;
  it->uv_top = enc->uv_top;
  InitLeft(it);
}